

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O2

Type * __thiscall
slang::ast::builtins::RandModeFunc::checkArguments
          (RandModeFunc *this,ASTContext *context,Args *args,SourceRange range,Expression *param_4)

{
  ulong uVar1;
  ulong min;
  bool bVar2;
  Compilation *pCVar3;
  reference ppEVar4;
  Type *pTVar5;
  
  pCVar3 = ASTContext::getCompilation(context);
  uVar1 = (context->flags).m_bits;
  min = (ulong)(((uint)uVar1 & 0x400) >> 10);
  bVar2 = SystemSubroutine::checkArgCount
                    (&this->super_SystemSubroutine,context,true,args,range,min,min);
  if (bVar2) {
    if ((uVar1 & 0x400) == 0) {
      pTVar5 = pCVar3->intType;
    }
    else {
      ppEVar4 = nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>
                ::operator[](args,1);
      pTVar5 = not_null<const_slang::ast::Type_*>::get(&(*ppEVar4)->type);
      bVar2 = Type::isIntegral(pTVar5);
      if (!bVar2) {
        ppEVar4 = nonstd::span_lite::
                  span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                            (args,1);
        pTVar5 = SystemSubroutine::badArg(&this->super_SystemSubroutine,context,*ppEVar4);
        return pTVar5;
      }
      pTVar5 = pCVar3->voidType;
    }
  }
  else {
    pTVar5 = pCVar3->errorType;
  }
  return pTVar5;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        // The number of arguments required is 1 if called as a task
        // and 0 if called as a function.
        auto& comp = context.getCompilation();
        size_t numArgs = context.flags.has(ASTFlags::TopLevelStatement) ? 1 : 0;
        if (!checkArgCount(context, true, args, range, numArgs, numArgs))
            return comp.getErrorType();

        if (numArgs) {
            // First argument is integral.
            if (!args[1]->type->isIntegral())
                return badArg(context, *args[1]);
        }

        return numArgs ? comp.getVoidType() : comp.getIntType();
    }